

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::AMFImporter::Find_NodeElement
          (AMFImporter *this,string *pID,EType pType,CAMFImporter_NodeElement **pNodeElement)

{
  CAMFImporter_NodeElement *pCVar1;
  bool bVar2;
  __type _Var3;
  reference ppCVar4;
  CAMFImporter_NodeElement *ne;
  const_iterator __end1;
  const_iterator __begin1;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range1;
  CAMFImporter_NodeElement **pNodeElement_local;
  EType pType_local;
  string *pID_local;
  AMFImporter *this_local;
  
  __end1 = std::__cxx11::
           list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                     (&this->mNodeElement_List);
  ne = (CAMFImporter_NodeElement *)
       std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
       end(&this->mNodeElement_List);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&ne);
    if (!bVar2) {
      return false;
    }
    ppCVar4 = std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator*(&__end1);
    pCVar1 = *ppCVar4;
    _Var3 = std::operator==(&pCVar1->ID,pID);
    if ((_Var3) && (pCVar1->Type == pType)) break;
    std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator++(&__end1);
  }
  if (pNodeElement != (CAMFImporter_NodeElement **)0x0) {
    *pNodeElement = pCVar1;
  }
  return true;
}

Assistant:

bool AMFImporter::Find_NodeElement(const std::string& pID, const CAMFImporter_NodeElement::EType pType, CAMFImporter_NodeElement** pNodeElement) const
{
	for(CAMFImporter_NodeElement* ne: mNodeElement_List)
	{
		if((ne->ID == pID) && (ne->Type == pType))
		{
			if(pNodeElement != nullptr) *pNodeElement = ne;

			return true;
		}
	}// for(CAMFImporter_NodeElement* ne: mNodeElement_List)

	return false;
}